

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O2

string * to_hex<unsigned_char>(string *__return_storage_ptr__,uint8_t t)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  ostringstream ostm;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostm);
  poVar3 = std::operator<<((ostream *)&ostm,"0x");
  poVar3 = std::operator<<(poVar3,0x30);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  std::ostream::operator<<(poVar3,(ushort)t);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostm);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_hex< uint8_t >(uint8_t t)
{
	std::ostringstream ostm;
	ostm << "0x" << std::setfill('0') << std::hex << std::setw(2) << static_cast<uint16_t>(t);
	return ostm.str();
}